

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_function.hpp
# Opt level: O2

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::MultiFileFunction<duckdb::ParquetMultiFileInfo>::MultiFileBind
          (MultiFileFunction<duckdb::ParquetMultiFileInfo> *this,ClientContext *context,
          TableFunctionBindInput *input,vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  string *str;
  MultiFileOptions file_options_p;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  ClientContext *context_00;
  reference pvVar4;
  pointer pMVar5;
  type base_options;
  NotImplementedException *this_00;
  __node_base *p_Var6;
  undefined1 auStack_238 [16];
  undefined1 local_228 [16];
  _Alloc_hider local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  shared_ptr<duckdb::MultiFileList,_true> file_list;
  unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true> uStack_1f8;
  shared_ptr<duckdb::MultiFileList,_true> local_1d8;
  undefined1 auStack_1c8 [24];
  undefined8 in_stack_fffffffffffffe50;
  string local_1a0;
  string loption;
  MultiFileOptions file_options;
  MultiFileOptions local_c8;
  
  MultiFileReader::Create((MultiFileReader *)(local_228 + 8),input->table_function);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)(local_228 + 8));
  pvVar4 = vector<duckdb::Value,_true>::get<true>(input->inputs,0);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)&file_list,context_00,(Value *)context,(FileGlobOptions)pvVar4);
  MultiFileOptions::MultiFileOptions(&file_options);
  ParquetMultiFileInfo::InitializeOptions
            ((ClientContext *)local_228,(optional_ptr<duckdb::TableFunctionInfo,_true>)context);
  p_Var6 = &(input->named_parameters->_M_h)._M_before_begin;
  do {
    p_Var6 = p_Var6->_M_nxt;
    if (p_Var6 == (__node_base *)0x0) {
      local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
      local_228._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1d8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = file_list.internal.
               super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1d8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      MultiFileOptions::MultiFileOptions(&local_c8,&file_options);
      uVar1 = local_228._0_8_;
      local_218._M_p = (pointer)local_228._0_8_;
      local_228._0_8_ =
           (__uniq_ptr_data<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true,_true>
            )0x0;
      file_options_p.hive_types_schema._M_h._M_buckets = (__buckets_ptr)&local_218;
      file_options_p._0_8_ = &local_c8;
      file_options_p.hive_types_schema._M_h._M_bucket_count = auStack_238._0_8_;
      file_options_p.hive_types_schema._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)auStack_238._8_8_;
      file_options_p.hive_types_schema._M_h._M_element_count = 0;
      file_options_p.hive_types_schema._M_h._M_rehash_policy._0_8_ = local_228._8_8_;
      file_options_p.hive_types_schema._M_h._M_rehash_policy._M_next_resize = uVar1;
      file_options_p.hive_types_schema._M_h._M_single_bucket = (__node_base_ptr)local_210._M_pi;
      file_options_p.filename_column._M_dataplus._M_p =
           (pointer)file_list.internal.
                    super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      file_options_p.filename_column._M_string_length =
           (size_type)
           file_list.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      file_options_p.filename_column.field_2._M_allocated_capacity =
           (size_type)
           uStack_1f8.super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
           super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
           super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
      file_options_p.filename_column.field_2._8_8_ = return_types;
      file_options_p.custom_options._M_h._M_buckets = (__buckets_ptr)names;
      file_options_p.custom_options._M_h._M_bucket_count = (size_type)this;
      file_options_p.custom_options._M_h._M_before_begin._M_nxt =
           (_Hash_node_base *)
           local_1d8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      file_options_p.custom_options._M_h._M_element_count =
           (size_type)
           local_1d8.internal.super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      file_options_p.custom_options._M_h._M_rehash_policy._M_max_load_factor =
           (float)auStack_1c8._0_4_;
      file_options_p.custom_options._M_h._M_rehash_policy._4_4_ = auStack_1c8._4_4_;
      file_options_p.custom_options._M_h._M_rehash_policy._M_next_resize = auStack_1c8._8_8_;
      file_options_p.custom_options._M_h._M_single_bucket = (__node_base_ptr)auStack_1c8._16_8_;
      MultiFileBindInternal
                (this,context,
                 (unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                  *)&local_210,&local_1d8,return_types,names,file_options_p,
                 (unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                  )in_stack_fffffffffffffe50);
      if ((_Tuple_impl<0UL,_duckdb::BaseFileReaderOptions_*,_std::default_delete<duckdb::BaseFileReaderOptions>_>
           )local_218._M_p != (BaseFileReaderOptions *)0x0) {
        (**(code **)(*(long *)local_218._M_p + 8))();
      }
      local_218._M_p = (pointer)0x0;
      MultiFileOptions::~MultiFileOptions(&local_c8);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_1d8.internal.
                  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(local_210._M_pi)->_vptr__Sp_counted_base[1])();
      }
      local_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if ((BaseFileReaderOptions *)local_228._0_8_ != (BaseFileReaderOptions *)0x0) {
        (**(code **)(*(long *)local_228._0_8_ + 8))();
      }
      MultiFileOptions::~MultiFileOptions(&file_options);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&file_list.internal.
                  super___shared_ptr<duckdb::MultiFileList,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        (*(*(_func_int ***)local_228._8_8_)[1])();
      }
      return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
    }
    str = (string *)(p_Var6 + 1);
    StringUtil::Lower((string *)&loption,str);
    pMVar5 = unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
             ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                           *)(local_228 + 8));
    iVar3 = (*pMVar5->_vptr_MultiFileReader[4])
                      (pMVar5,(string *)&loption,(Value *)(p_Var6 + 5),&file_options,context);
    if ((char)iVar3 == '\0') {
      base_options = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                     ::operator*((unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
                                  *)local_228);
      bVar2 = ParquetMultiFileInfo::ParseOption
                        (context,(string *)str,(Value *)(p_Var6 + 5),&file_options,base_options);
      if (!bVar2) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_1a0,"Unimplemented option %s",(allocator *)(auStack_238 + 0xf));
        ::std::__cxx11::string::string((string *)(auStack_1c8 + 8),(string *)str);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_00,&local_1a0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (auStack_1c8 + 8));
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
    }
    ::std::__cxx11::string::~string((string *)&loption);
  } while( true );
}

Assistant:

static unique_ptr<FunctionData> MultiFileBind(ClientContext &context, TableFunctionBindInput &input,
	                                              vector<LogicalType> &return_types, vector<string> &names) {
		auto multi_file_reader = MultiFileReader::Create(input.table_function);
		auto file_list = multi_file_reader->CreateFileList(context, input.inputs[0]);
		MultiFileOptions file_options;

		auto options = OP::InitializeOptions(context, input.info);
		for (auto &kv : input.named_parameters) {
			auto loption = StringUtil::Lower(kv.first);
			if (multi_file_reader->ParseOption(loption, kv.second, file_options, context)) {
				continue;
			}
			if (OP::ParseOption(context, kv.first, kv.second, file_options, *options)) {
				continue;
			}
			throw NotImplementedException("Unimplemented option %s", kv.first);
		}
		return MultiFileBindInternal(context, std::move(multi_file_reader), std::move(file_list), return_types, names,
		                             std::move(file_options), std::move(options));
	}